

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# capture.h
# Opt level: O2

void __thiscall server::captureservmode::regenowners(captureservmode *this,baseinfo *b,int ticks)

{
  long lVar1;
  bool bVar2;
  int iVar3;
  uint uVar4;
  uint uVar5;
  ulong uVar6;
  uint uVar7;
  ulong uVar8;
  int i;
  long lVar9;
  ulong uVar10;
  
  lVar9 = 0;
  do {
    if (DAT_00191854 <= lVar9) {
      return;
    }
    lVar1 = *(long *)(clients + lVar9 * 8);
    if ((((*(int *)(lVar1 + 0x3c4) == 0) && (*(char *)(lVar1 + 0x124) != '\0')) &&
        (iVar3 = strcmp((char *)(lVar1 + 0x124),b->owner), iVar3 == 0)) &&
       (bVar2 = insidebase(this,b,(vec *)(lVar1 + 0x3b8)), bVar2)) {
      uVar5 = *(uint *)(lVar1 + 0x350);
      uVar7 = *(uint *)(lVar1 + 0x354);
      bVar2 = (int)uVar5 < (int)uVar7;
      if ((int)uVar5 < (int)uVar7) {
        uVar5 = uVar5 + ticks * 10;
        if ((int)uVar7 <= (int)uVar5) {
          uVar5 = uVar7;
        }
        ((fpsstate *)(lVar1 + 0x350))->health = uVar5;
      }
      if (*(int *)(lVar1 + 0x35c) == 1) {
        uVar7 = *(uint *)(lVar1 + 0x358);
        uVar8 = (ulong)uVar7;
        if ((int)uVar7 < 100) goto LAB_00144b2f;
      }
      else {
        *(undefined4 *)(lVar1 + 0x35c) = 1;
        uVar7 = 0;
LAB_00144b2f:
        uVar7 = uVar7 + ticks * 10;
        uVar8 = (ulong)uVar7;
        if (99 < (int)uVar7) {
          uVar8 = 100;
        }
        *(int *)(lVar1 + 0x358) = (int)uVar8;
        bVar2 = true;
      }
      uVar7 = b->ammotype;
      uVar6 = (ulong)uVar7;
      uVar4 = uVar7 - 1;
      if ((uVar4 < 6) && (*(int *)(lVar1 + 0x36c + uVar6 * 4) < itemstats[uVar4].max)) {
        fpsstate::addammo((fpsstate *)(lVar1 + 0x350),uVar7,ticks * 0x14,100);
        uVar5 = *(uint *)(lVar1 + 0x350);
        uVar8 = (ulong)*(uint *)(lVar1 + 0x358);
        uVar6 = (ulong)(uint)b->ammotype;
        uVar4 = b->ammotype - 1;
      }
      else if (!bVar2) goto LAB_00144aaa;
      uVar10 = 0;
      if (uVar4 < 6) {
        uVar10 = (ulong)*(uint *)(lVar1 + 0x36c + uVar6 * 4);
      }
      sendf(-1,1,"ri6",0x45,(ulong)*(uint *)(lVar1 + 8),(ulong)uVar5,uVar8,uVar6,uVar10);
    }
LAB_00144aaa:
    lVar9 = lVar9 + 1;
  } while( true );
}

Assistant:

loopv(clients)
        {
            clientinfo *ci = clients[i];
            if(ci->state.state==CS_ALIVE && ci->team[0] && !strcmp(ci->team, b.owner) && insidebase(b, ci->state.o))
            {
                bool notify = false;
                if(ci->state.health < ci->state.maxhealth)
                {
                    ci->state.health = min(ci->state.health + ticks*REGENHEALTH, ci->state.maxhealth);
                    notify = true;
                }
                if(ci->state.armourtype != A_GREEN || ci->state.armour < itemstats[I_GREENARMOUR-I_SHELLS].max)
                {
                    if(ci->state.armourtype != A_GREEN)
                    {
                        ci->state.armourtype = A_GREEN;
                        ci->state.armour = 0;
                    }
                    ci->state.armour = min(ci->state.armour + ticks*REGENARMOUR, itemstats[I_GREENARMOUR-I_SHELLS].max);
                    notify = true;
                }
                if(b.valid())
                {
                    int ammotype = b.ammotype-1+I_SHELLS;
                    if(!ci->state.hasmaxammo(ammotype))
                    {
                        ci->state.addammo(b.ammotype, ticks*REGENAMMO, 100);
                        notify = true;
                    }
                }
                if(notify)
                    sendf(-1, 1, "ri6", N_BASEREGEN, ci->clientnum, ci->state.health, ci->state.armour, b.ammotype, b.valid() ? ci->state.ammo[b.ammotype] : 0);
            }
        }